

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

bool __thiscall slang::ast::EvalContext::step(EvalContext *this,SourceLocation loc)

{
  uint uVar1;
  Compilation *this_00;
  CompilationOptions *pCVar2;
  long in_RDI;
  EvalContext *unaff_retaddr;
  SourceLocation in_stack_00000008;
  DiagCode in_stack_00000014;
  bool local_1;
  
  uVar1 = *(int *)(in_RDI + 0x3c) + 1;
  *(uint *)(in_RDI + 0x3c) = uVar1;
  this_00 = getCompilation((EvalContext *)0xa258b9);
  pCVar2 = Compilation::getOptions(this_00);
  local_1 = pCVar2->maxConstexprSteps <= uVar1;
  if (local_1) {
    addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool EvalContext::step(SourceLocation loc) {
    if (++steps < getCompilation().getOptions().maxConstexprSteps)
        return true;

    addDiag(diag::ConstEvalExceededMaxSteps, loc);
    return false;
}